

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
* __thiscall
kratos::GeneratorGraph::get_leveled_nodes
          (vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
           *__return_storage_ptr__,GeneratorGraph *this)

{
  mapped_type mVar1;
  bool bVar2;
  bool bVar3;
  mapped_type *pmVar4;
  reference __in;
  type *ppGVar5;
  type_conflict1 *ptVar6;
  vector<kratos::Generator*,std::allocator<kratos::Generator*>> *this_00;
  type *level;
  type *generator_node;
  _Node_iterator_base<std::pair<kratos::GeneratorNode_*const,_unsigned_int>,_false> local_170;
  iterator __end1;
  iterator __begin1;
  unordered_map<kratos::GeneratorNode_*,_unsigned_int,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>_>
  *__range1;
  element_type *local_150;
  pair<kratos::Generator_*,_unsigned_int> local_148;
  __shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *local_138;
  shared_ptr<kratos::Generator> *child_generator;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  *__range2;
  _Node_iterator_base<std::pair<kratos::GeneratorNode_*const,_unsigned_int>,_false> local_f8;
  GeneratorNode *local_f0;
  key_type *local_e8;
  GeneratorNode **node;
  type *current_level;
  type *generator;
  uint local_c8;
  uint32_t max_level;
  int local_b4;
  pair<kratos::Generator_*,_unsigned_int> local_b0;
  undefined1 local_a0 [8];
  unordered_map<kratos::GeneratorNode_*,_unsigned_int,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>_>
  level_index;
  queue<std::pair<kratos::Generator_*,_unsigned_int>,_std::deque<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>_>
  queue;
  GeneratorGraph *this_local;
  vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
  *result;
  
  std::
  queue<std::pair<kratos::Generator*,unsigned_int>,std::deque<std::pair<kratos::Generator*,unsigned_int>,std::allocator<std::pair<kratos::Generator*,unsigned_int>>>>
  ::
  queue<std::deque<std::pair<kratos::Generator*,unsigned_int>,std::allocator<std::pair<kratos::Generator*,unsigned_int>>>,void>
            ((queue<std::pair<kratos::Generator*,unsigned_int>,std::deque<std::pair<kratos::Generator*,unsigned_int>,std::allocator<std::pair<kratos::Generator*,unsigned_int>>>>
              *)&level_index._M_h._M_single_bucket);
  std::
  unordered_map<kratos::GeneratorNode_*,_unsigned_int,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>_>
  ::unordered_map((unordered_map<kratos::GeneratorNode_*,_unsigned_int,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>_>
                   *)local_a0);
  local_b4 = 0;
  std::pair<kratos::Generator_*,_unsigned_int>::pair<kratos::Generator_*&,_int,_true>
            (&local_b0,&this->root_,&local_b4);
  std::
  queue<std::pair<kratos::Generator_*,_unsigned_int>,_std::deque<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>_>
  ::push((queue<std::pair<kratos::Generator_*,_unsigned_int>,_std::deque<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>_>
          *)&level_index._M_h._M_single_bucket,&local_b0);
  local_c8 = 0;
  while (bVar2 = std::
                 queue<std::pair<kratos::Generator_*,_unsigned_int>,_std::deque<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>_>
                 ::empty((queue<std::pair<kratos::Generator_*,_unsigned_int>,_std::deque<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>_>
                          *)&level_index._M_h._M_single_bucket), ((bVar2 ^ 0xffU) & 1) != 0) {
    generator = &std::
                 queue<std::pair<kratos::Generator_*,_unsigned_int>,_std::deque<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>_>
                 ::front((queue<std::pair<kratos::Generator_*,_unsigned_int>,_std::deque<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>_>
                          *)&level_index._M_h._M_single_bucket)->first;
    current_level =
         (type *)std::get<0ul,kratos::Generator*,unsigned_int>
                           ((pair<kratos::Generator_*,_unsigned_int> *)generator);
    node = (GeneratorNode **)
           std::get<1ul,kratos::Generator*,unsigned_int>
                     ((pair<kratos::Generator_*,_unsigned_int> *)generator);
    std::
    queue<std::pair<kratos::Generator_*,_unsigned_int>,_std::deque<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>_>
    ::pop((queue<std::pair<kratos::Generator_*,_unsigned_int>,_std::deque<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>_>
           *)&level_index._M_h._M_single_bucket);
    local_f0 = get_node(this,*(Generator **)current_level);
    local_e8 = &local_f0;
    local_f8._M_cur =
         (__node_type *)
         std::
         unordered_map<kratos::GeneratorNode_*,_unsigned_int,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>_>
         ::find((unordered_map<kratos::GeneratorNode_*,_unsigned_int,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>_>
                 *)local_a0,local_e8);
    __range2 = (vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                *)std::
                  unordered_map<kratos::GeneratorNode_*,_unsigned_int,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>_>
                  ::end((unordered_map<kratos::GeneratorNode_*,_unsigned_int,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>_>
                         *)local_a0);
    bVar3 = std::__detail::operator==
                      (&local_f8,
                       (_Node_iterator_base<std::pair<kratos::GeneratorNode_*const,_unsigned_int>,_false>
                        *)&__range2);
    bVar2 = true;
    if (!bVar3) {
      pmVar4 = std::
               unordered_map<kratos::GeneratorNode_*,_unsigned_int,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>_>
               ::at((unordered_map<kratos::GeneratorNode_*,_unsigned_int,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>_>
                     *)local_a0,local_e8);
      bVar2 = *pmVar4 < *(uint *)node;
    }
    if (bVar2) {
      mVar1 = *(mapped_type *)node;
      pmVar4 = std::
               unordered_map<kratos::GeneratorNode_*,_unsigned_int,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>_>
               ::operator[]((unordered_map<kratos::GeneratorNode_*,_unsigned_int,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>_>
                             *)local_a0,local_e8);
      *pmVar4 = mVar1;
    }
    Generator::get_child_generators
              ((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                *)&__begin2,*(Generator **)current_level);
    __end2 = std::
             vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
             ::begin((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                      *)&__begin2);
    child_generator =
         (shared_ptr<kratos::Generator> *)
         std::
         vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
         ::end((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                *)&__begin2);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::shared_ptr<kratos::Generator>_*,_std::vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>
                                       *)&child_generator), bVar2) {
      local_138 = &__gnu_cxx::
                   __normal_iterator<std::shared_ptr<kratos::Generator>_*,_std::vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>
                   ::operator*(&__end2)->
                   super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>;
      local_150 = std::__shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>::get(local_138);
      __range1._4_4_ = *(int *)node + 1;
      std::pair<kratos::Generator_*,_unsigned_int>::pair<kratos::Generator_*,_unsigned_int,_true>
                (&local_148,&local_150,(uint *)((long)&__range1 + 4));
      std::
      queue<std::pair<kratos::Generator_*,_unsigned_int>,_std::deque<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>_>
      ::push((queue<std::pair<kratos::Generator_*,_unsigned_int>,_std::deque<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>_>
              *)&level_index._M_h._M_single_bucket,&local_148);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<kratos::Generator>_*,_std::vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
    ::~vector((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
               *)&__begin2);
    if (local_c8 < *(uint *)node) {
      local_c8 = *(uint *)node;
    }
  }
  __range1._3_1_ = 0;
  std::
  vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
  ::vector(__return_storage_ptr__);
  std::
  vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
  ::resize(__return_storage_ptr__,(ulong)(local_c8 + 1));
  __end1 = std::
           unordered_map<kratos::GeneratorNode_*,_unsigned_int,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>_>
           ::begin((unordered_map<kratos::GeneratorNode_*,_unsigned_int,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>_>
                    *)local_a0);
  local_170._M_cur =
       (__node_type *)
       std::
       unordered_map<kratos::GeneratorNode_*,_unsigned_int,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>_>
       ::end((unordered_map<kratos::GeneratorNode_*,_unsigned_int,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>_>
              *)local_a0);
  while (bVar2 = std::__detail::operator!=
                           (&__end1.
                             super__Node_iterator_base<std::pair<kratos::GeneratorNode_*const,_unsigned_int>,_false>
                            ,&local_170), bVar2) {
    __in = std::__detail::
           _Node_iterator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>,_false,_false>::
           operator*(&__end1);
    ppGVar5 = std::get<0ul,kratos::GeneratorNode*const,unsigned_int>(__in);
    ptVar6 = std::get<1ul,kratos::GeneratorNode*const,unsigned_int>(__in);
    this_00 = (vector<kratos::Generator*,std::allocator<kratos::Generator*>> *)
              std::
              vector<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>,_std::allocator<std::vector<kratos::Generator_*,_std::allocator<kratos::Generator_*>_>_>_>
              ::operator[](__return_storage_ptr__,(ulong)*ptVar6);
    std::vector<kratos::Generator*,std::allocator<kratos::Generator*>>::
    emplace_back<kratos::Generator*&>(this_00,&(*ppGVar5)->generator);
    std::__detail::
    _Node_iterator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>,_false,_false>::operator++
              (&__end1);
  }
  __range1._3_1_ = 1;
  std::
  unordered_map<kratos::GeneratorNode_*,_unsigned_int,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>_>
  ::~unordered_map((unordered_map<kratos::GeneratorNode_*,_unsigned_int,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<std::pair<kratos::GeneratorNode_*const,_unsigned_int>_>_>
                    *)local_a0);
  std::
  queue<std::pair<kratos::Generator_*,_unsigned_int>,_std::deque<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>_>
  ::~queue((queue<std::pair<kratos::Generator_*,_unsigned_int>,_std::deque<std::pair<kratos::Generator_*,_unsigned_int>,_std::allocator<std::pair<kratos::Generator_*,_unsigned_int>_>_>_>
            *)&level_index._M_h._M_single_bucket);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<Generator *>> GeneratorGraph::get_leveled_nodes() {
    // this is a modified breath-first search
    std::queue<std::pair<Generator *, uint32_t>> queue;
    std::unordered_map<GeneratorNode *, uint32_t> level_index;

    queue.push({root_, 0});
    uint32_t max_level = 0;

    while (!queue.empty()) {
        const auto &[generator, current_level] = queue.front();
        queue.pop();
        auto const &node = get_node(generator);
        if (level_index.find(node) == level_index.end() || level_index.at(node) < current_level) {
            // update the new level
            level_index[node] = current_level;
        }
        // loop through all the child generators
        for (const auto &child_generator : generator->get_child_generators()) {
            queue.push({child_generator.get(), current_level + 1});
        }
        if (current_level > max_level) max_level = current_level;
    }

    // construct the result
    std::vector<std::vector<Generator *>> result;
    // notice that max is exclusive
    result.resize(max_level + 1);
    for (auto const &[generator_node, level] : level_index) {
        result[level].emplace_back(generator_node->generator);
    }
    return result;
}